

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall QGraphicsPathItem::QGraphicsPathItem(QGraphicsPathItem *this,QGraphicsItem *parent)

{
  QGraphicsPathItemPrivate *this_00;
  
  this_00 = (QGraphicsPathItemPrivate *)operator_new(0x1b0);
  QGraphicsPathItemPrivate::QGraphicsPathItemPrivate(this_00);
  QAbstractGraphicsShapeItem::QAbstractGraphicsShapeItem
            (&this->super_QAbstractGraphicsShapeItem,(QAbstractGraphicsShapeItemPrivate *)this_00,
             parent);
  (this->super_QAbstractGraphicsShapeItem).super_QGraphicsItem._vptr_QGraphicsItem =
       (_func_int **)&PTR__QGraphicsPixmapItem_007eb858;
  return;
}

Assistant:

QGraphicsPathItem::QGraphicsPathItem(QGraphicsItem *parent)
    : QAbstractGraphicsShapeItem(*new QGraphicsPathItemPrivate, parent)
{
}